

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_instructions.c
# Opt level: O0

uint8_t implied_RTI(cpu_registers *registers)

{
  uint8_t uVar1;
  cpu_registers *registers_local;
  
  uVar1 = get_flags_preserve_bits(registers);
  registers->flags = uVar1;
  pop_PC_off_stack(registers);
  return '\0';
}

Assistant:

uint8_t implied_RTI(cpu_registers* registers) {
    registers->flags = get_flags_preserve_bits(registers);
    pop_PC_off_stack(registers);
    return ZERO_EXTRA_CYCLES;
}